

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestGetTexParameter::initTestRuns(TextureViewTestGetTexParameter *this)

{
  int iVar1;
  GLenum GVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLuint *local_130;
  GLint *local_128;
  GLint local_10c;
  GLint local_108;
  GLint parent_n_immutable_levels;
  GLint parent_num_levels;
  GLint parent_num_layers;
  GLint parent_min_layer;
  GLint parent_min_level;
  GLuint *view_id_ptr;
  GLuint *parent_id_ptr;
  uint local_e0;
  uint n_iteration;
  uint n_iterations;
  uint actual_texture_depth;
  int parent_texture_width;
  int parent_texture_height;
  int parent_texture_depth;
  GLint n_num_levels;
  GLint n_min_level;
  GLint n_num_layers;
  GLint n_min_layer;
  int n_levels_needed;
  GLenum texture_target;
  _test_run new_test_run;
  uint n_texture_target;
  _test_texture_type texture_type;
  uint n_texture_type;
  uint n_texture_types;
  uint n_texture_targets;
  _test_texture_type texture_types [5];
  GLuint local_58 [2];
  GLenum texture_targets [10];
  int texture_width;
  int texture_height;
  int texture_depth;
  int n_cubemaps_needed;
  Functions *gl;
  TextureViewTestGetTexParameter *this_local;
  Functions *gl_00;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  memcpy(local_58,&DAT_02a4c3d0,0x28);
  _n_texture_types = 0x100000000;
  texture_types[0] = TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT;
  texture_types[1] = TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT;
  texture_types[2] = TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW;
  for (n_texture_target = 0; n_texture_target < 5; n_texture_target = n_texture_target + 1) {
    new_test_run.texture_type = (&n_texture_types)[n_texture_target];
    for (new_test_run.texture_target = 0; new_test_run.texture_target < 10;
        new_test_run.texture_target = new_test_run.texture_target + 1) {
      _test_run::_test_run((_test_run *)&n_levels_needed);
      n_min_layer = texture_targets[(ulong)new_test_run.texture_target - 2];
      if ((n_min_layer != 0x8c2a) ||
         (new_test_run.texture_type != TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT)) {
        n_num_layers = 6;
        n_num_levels = 2;
        parent_texture_depth = 2;
        parent_texture_height = 3;
        parent_texture_width = 0x10;
        actual_texture_depth = 0x20;
        new_test_run.texture_view_object_created_from_view_to_id = new_test_run.texture_type;
        if ((n_min_layer == 0x8513) || (n_min_layer == 0x9009)) {
          n_num_levels = 0xc;
          actual_texture_depth = 0x40;
          parent_texture_width = 0x40;
        }
        n_iterations = 0x40;
        if (n_min_layer == 0x8513U) {
          n_num_levels = 6;
        }
        n_min_level = (GLint)(n_min_layer != 0x8513U);
        if (n_min_layer == 0x9009) {
          n_min_level = 0;
        }
        if ((((n_min_layer == 0xde0) || (n_min_layer == 0xde1)) || (n_min_layer == 0x9100)) ||
           ((n_min_layer == 0x806f || (n_min_layer == 0x84f5)))) {
          n_min_level = 0;
          n_num_levels = 1;
        }
        if (((n_min_layer == 0x9100) || (n_min_layer == 0x9102)) || (n_min_layer == 0x84f5)) {
          parent_texture_depth = 0;
        }
        new_test_run.texture_view_object_created_from_immutable_to_id = n_min_layer;
        (*gl_00->genTextures)(1,(GLuint *)&new_test_run.expected_n_num_layers);
        GVar2 = (*gl_00->getError)();
        glu::checkError(GVar2,"glGenTextures() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0xaf7);
        (*gl_00->bindTexture)(n_min_layer,new_test_run.expected_n_num_layers);
        GVar2 = (*gl_00->getError)();
        glu::checkError(GVar2,"glBindTexture() call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0xafa);
        if (new_test_run.texture_type != TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED) {
          TextureViewUtilities::initTextureStorage
                    (gl_00,new_test_run.texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT,
                     n_min_layer,parent_texture_width,actual_texture_depth,n_iterations,0x8058,
                     0x1908,0x1401,6,4,0);
        }
        if (((new_test_run.texture_type == TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT) ||
            (new_test_run.texture_type ==
             TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT)) ||
           (new_test_run.texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW))
        {
          n_levels_needed = 6;
          new_test_run.expected_n_min_layer = 1;
          new_test_run.expected_n_min_level = 6;
          if (n_min_layer == 0x84f5) {
            n_levels_needed = 1;
            new_test_run.expected_n_min_level = 1;
          }
          else if (n_min_layer == 0x8513) {
            new_test_run.expected_n_min_layer = 6;
          }
          else if (n_min_layer == 0x8c18) {
            new_test_run.expected_n_min_layer = 0x20;
          }
          else if (n_min_layer == 0x8c1a) {
            new_test_run.expected_n_min_layer = 0x10;
          }
          else if (n_min_layer == 0x9009) {
            n_iteration = 0x18;
            new_test_run.expected_n_min_layer = 0x18;
          }
          else if (n_min_layer == 0x9100) {
            n_levels_needed = 1;
            new_test_run.expected_n_min_level = 1;
          }
          else if (n_min_layer == 0x9102) {
            n_levels_needed = 1;
            new_test_run.expected_n_min_level = 1;
            new_test_run.expected_n_min_layer = 0x10;
          }
        }
        if ((new_test_run.texture_type ==
             TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT) ||
           (new_test_run.texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW))
        {
          local_e0 = 1;
          if (new_test_run.texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW)
          {
            local_e0 = 2;
          }
          for (parent_id_ptr._4_4_ = 0; parent_id_ptr._4_4_ < local_e0;
              parent_id_ptr._4_4_ = parent_id_ptr._4_4_ + 1) {
            if (parent_id_ptr._4_4_ == 0) {
              local_128 = &new_test_run.expected_n_num_layers;
            }
            else {
              local_128 = &new_test_run.expected_n_num_levels;
            }
            view_id_ptr = (GLuint *)local_128;
            if (parent_id_ptr._4_4_ == 0) {
              local_130 = (GLuint *)&new_test_run.expected_n_num_levels;
            }
            else {
              local_130 = &new_test_run.parent_texture_object_id;
            }
            _parent_min_layer = local_130;
            (*gl_00->genTextures)(1,local_130);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glGenTextures() call failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb71);
            (*gl_00->textureView)
                      (*_parent_min_layer,
                       new_test_run.texture_view_object_created_from_immutable_to_id,*view_id_ptr,
                       0x8058,parent_texture_depth,parent_texture_height,n_min_level,n_num_levels);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glTextureView() call failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb76);
            parent_num_layers = -1;
            parent_num_levels = -1;
            parent_n_immutable_levels = -1;
            local_108 = -1;
            local_10c = -1;
            (*gl_00->bindTexture)(n_min_layer,*view_id_ptr);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,"glBindTexture() call failed",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb80);
            (*gl_00->getTexParameteriv)(n_min_layer,0x82df,&local_10c);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,
                            "glGetTexParameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname queried for parent object"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb85);
            (*gl_00->getTexParameteriv)(n_min_layer,0x82dd,&parent_num_levels);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,
                            "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname queried for parent object"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb8a);
            (*gl_00->getTexParameteriv)(n_min_layer,0x82db,&parent_num_layers);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,
                            "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname queried for parent object"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb8f);
            (*gl_00->getTexParameteriv)(n_min_layer,0x82de,&parent_n_immutable_levels);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,
                            "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname queried for parent object"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb94);
            (*gl_00->getTexParameteriv)(n_min_layer,0x82dc,&local_108);
            GVar2 = (*gl_00->getError)();
            glu::checkError(GVar2,
                            "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname queried for parent object"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                            ,0xb99);
            n_levels_needed = local_10c;
            new_test_run.expected_n_immutable_levels = parent_texture_depth + parent_num_layers;
            texture_target = n_min_level + parent_num_levels;
            if (parent_n_immutable_levels - n_min_level < n_num_levels) {
              new_test_run.expected_n_min_layer = parent_n_immutable_levels - n_min_level;
            }
            else {
              new_test_run.expected_n_min_layer = n_num_levels;
            }
            if (local_108 - parent_texture_depth < parent_texture_height) {
              new_test_run.expected_n_min_level = local_108 - parent_texture_depth;
            }
            else {
              new_test_run.expected_n_min_level = parent_texture_height;
            }
          }
        }
        std::
        vector<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
        ::push_back(&this->m_test_runs,(value_type *)&n_levels_needed);
      }
    }
  }
  return;
}

Assistant:

void TextureViewTestGetTexParameter::initTestRuns()
{
	const glw::Functions& gl				= m_context.getRenderContext().getFunctions();
	const int			  n_cubemaps_needed = 4; /* only used for GL_TEXTURE_CUBE_MAP_ARRAY */
	const int			  texture_depth		= 16;
	const int			  texture_height	= 32;
	const int			  texture_width		= 64;

	const glw::GLenum texture_targets[] = {
		GL_TEXTURE_1D,		 GL_TEXTURE_1D_ARRAY,		GL_TEXTURE_2D,
		GL_TEXTURE_2D_ARRAY, GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY,
		GL_TEXTURE_3D,		 GL_TEXTURE_CUBE_MAP,		GL_TEXTURE_CUBE_MAP_ARRAY,
		GL_TEXTURE_RECTANGLE
	};
	const _test_texture_type texture_types[] = { TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED,
												 TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW };
	const unsigned int n_texture_targets = sizeof(texture_targets) / sizeof(texture_targets[0]);
	const unsigned int n_texture_types   = sizeof(texture_types) / sizeof(texture_types[0]);

	/* Iterate through all texture types supported by the test */
	for (unsigned int n_texture_type = 0; n_texture_type < n_texture_types; ++n_texture_type)
	{
		const _test_texture_type texture_type = texture_types[n_texture_type];

		/* Iterate through all texture targets supported by the test */
		for (unsigned int n_texture_target = 0; n_texture_target < n_texture_targets; ++n_texture_target)
		{
			_test_run		  new_test_run;
			const glw::GLenum texture_target = texture_targets[n_texture_target];

			/* Texture buffers are neither immutable nor mutable. In order to avoid testing
			 * them in both cases, let's assume they are immutable objects */
			if (texture_target == GL_TEXTURE_BUFFER && texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT)
			{
				continue;
			}

			/* Set up test run properties. Since we're only testing a single
			 * configuration, we can set these to predefined values..
			 */
			const int  n_levels_needed		 = 6;
			glw::GLint n_min_layer			 = 1;
			glw::GLint n_num_layers			 = 2;
			glw::GLint n_min_level			 = 2;
			glw::GLint n_num_levels			 = 3;
			int		   parent_texture_depth  = texture_depth;
			int		   parent_texture_height = texture_height;
			int		   parent_texture_width  = texture_width;

			new_test_run.texture_target = texture_target;
			new_test_run.texture_type   = texture_type;

			/* Take note of target-specific restrictions */
			if (texture_target == GL_TEXTURE_CUBE_MAP || texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				n_num_layers = 6 /* layer-faces */ * 2; /* as per spec */

				/* Make sure that cube face width matches its height */
				parent_texture_height = 64;
				parent_texture_width  = 64;

				/* Also change the depth so that there's at least a few layers
				 * we can use in the test for GL_TEXTURE_CUBE_MAP_ARRAY case
				 */
				parent_texture_depth = 64;
			}

			if (texture_target == GL_TEXTURE_CUBE_MAP)
			{
				/* Texture views created from a cube map texture should always
				 * use a minimum layer of zero
				 */
				n_min_layer  = 0;
				n_num_layers = 6;
			}

			if (texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				/* Slightly modify the values we'll use for <minlayer>
				 * and <numlayers> arguments passed to glTextureView() calls
				 * so that we can test the "view from view from texture" case
				 */
				n_min_layer = 0;
			}

			if (texture_target == GL_TEXTURE_1D || texture_target == GL_TEXTURE_2D ||
				texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_3D ||
				texture_target == GL_TEXTURE_RECTANGLE)
			{
				/* All these texture targets are single-layer only. glTextureView()
				 * also requires <numlayers> argument to be set to 1 for them, so
				 * take this into account.
				 **/
				n_min_layer  = 0;
				n_num_layers = 1;
			}

			if (texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
				texture_target == GL_TEXTURE_RECTANGLE)
			{
				/* All these texture targets do not support mip-maps */
				n_min_level = 0;
			}

			/* Initialize parent texture object */
			gl.genTextures(1, &new_test_run.parent_texture_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

			gl.bindTexture(texture_target, new_test_run.parent_texture_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

			if (texture_type != TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED)
			{
				TextureViewUtilities::initTextureStorage(gl, (texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT),
														 texture_target, parent_texture_depth, parent_texture_height,
														 parent_texture_width, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE,
														 n_levels_needed, n_cubemaps_needed, 0); /* bo_id */
			}

			/* Update expected view-specific property values to include interactions
			 * with immutable textures. */
			if (texture_type == TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW)
			{
				/* Set expected GL_TEXTURE_IMMUTABLE_LEVELS property value to the number
				 * of levels we'll be using for the immutable texture storage. For selected
				 * texture targets that do no take <levels> argument, we'll change this
				 * value on a case-by-case basis.
				 */
				new_test_run.expected_n_immutable_levels = n_levels_needed;

				/* Set expected GL_TEXTURE_VIEW_NUM_LAYERS property value to 1, as per GL spec.
				 * This value will be modified for selected texture targets */
				new_test_run.expected_n_num_layers = 1;

				/* Configured expected GL_TEXTURE_VIEW_NUM_LEVELS value as per GL spec */
				new_test_run.expected_n_num_levels = n_levels_needed;

				/* Initialize immutable texture storage */
				switch (texture_target)
				{
				case GL_TEXTURE_1D_ARRAY:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_height;

					break;
				}

				case GL_TEXTURE_CUBE_MAP:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = 6;

					break;
				}

				case GL_TEXTURE_RECTANGLE:
				{
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					break;
				}

				case GL_TEXTURE_2D_ARRAY:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_depth;

					break;
				}

				case GL_TEXTURE_2D_MULTISAMPLE:
				{
					/* 2D multisample texture are not mip-mapped, so update
					 * expected GL_TEXTURE_IMMUTABLE_LEVELS and GL_TEXTURE_VIEW_NUM_LEVELS
					 * value accordingly */
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					break;
				}

				case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
				{
					/* 2D multisample array textures are not mip-mapped, so update
					 * expected GL_TEXTURE_IMMUTABLE_LEVELS and GL_TEXTURE_VIEW_NUM_LEVELS
					 * values accordingly */
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_depth;

					break;
				}

				case GL_TEXTURE_CUBE_MAP_ARRAY:
				{
					const unsigned int actual_texture_depth = 6 /* layer-faces */ * n_cubemaps_needed;

					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = actual_texture_depth;

					break;
				}
				} /* switch (texture_target) */
			}

			/* Initialize the view(s) */
			if (texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW)
			{
				const unsigned int n_iterations =
					(texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW) ? 2 : 1;

				for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
				{
					glw::GLuint* parent_id_ptr = (n_iteration == 0) ?
													 &new_test_run.parent_texture_object_id :
													 &new_test_run.texture_view_object_created_from_immutable_to_id;
					glw::GLuint* view_id_ptr = (n_iteration == 0) ?
												   &new_test_run.texture_view_object_created_from_immutable_to_id :
												   &new_test_run.texture_view_object_created_from_view_to_id;

					gl.genTextures(1, view_id_ptr);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

					gl.textureView(*view_id_ptr, new_test_run.texture_target, *parent_id_ptr,
								   GL_RGBA8, /* use the parent texture object's internalformat */
								   n_min_level, n_num_levels, n_min_layer, n_num_layers);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

					/* Query parent object's properties */
					glw::GLint parent_min_level			 = -1;
					glw::GLint parent_min_layer			 = -1;
					glw::GLint parent_num_layers		 = -1;
					glw::GLint parent_num_levels		 = -1;
					glw::GLint parent_n_immutable_levels = -1;

					gl.bindTexture(texture_target, *parent_id_ptr);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_IMMUTABLE_LEVELS, &parent_n_immutable_levels);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_MIN_LAYER, &parent_min_layer);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_MIN_LEVEL, &parent_min_level);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_NUM_LAYERS, &parent_num_layers);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_NUM_LEVELS, &parent_num_levels);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname queried for parent object");

					/* Update test run-specific expected values as per GL_ARB_texture_view extension specification */
					/*
					 * - TEXTURE_IMMUTABLE_LEVELS is set to the value of TEXTURE_IMMUTABLE_LEVELS
					 *   from the original texture.
					 */
					new_test_run.expected_n_immutable_levels = parent_n_immutable_levels;

					/*
					 * - TEXTURE_VIEW_MIN_LEVEL is set to <minlevel> plus the value of
					 *   TEXTURE_VIEW_MIN_LEVEL from the original texture.
					 */
					new_test_run.expected_n_min_level = n_min_level + parent_min_level;

					/*
					 * - TEXTURE_VIEW_MIN_LAYER is set to <minlayer> plus the value of
					 *   TEXTURE_VIEW_MIN_LAYER from the original texture.
					 */
					new_test_run.expected_n_min_layer = n_min_layer + parent_min_layer;

					/*
					 * - TEXTURE_VIEW_NUM_LAYERS is set to the lesser of <numlayers> and the
					 *   value of TEXTURE_VIEW_NUM_LAYERS from the original texture minus
					 *   <minlayer>.
					 *
					 */
					if ((parent_num_layers - n_min_layer) < n_num_layers)
					{
						new_test_run.expected_n_num_layers = parent_num_layers - n_min_layer;
					}
					else
					{
						new_test_run.expected_n_num_layers = n_num_layers;
					}

					/*
					 * - TEXTURE_VIEW_NUM_LEVELS is set to the lesser of <numlevels> and the
					 *   value of TEXTURE_VIEW_NUM_LEVELS from the original texture minus
					 *   <minlevels>.
					 *
					 */
					if ((parent_num_levels - n_min_level) < n_num_levels)
					{
						new_test_run.expected_n_num_levels = parent_num_levels - n_min_level;
					}
					else
					{
						new_test_run.expected_n_num_levels = n_num_levels;
					}
				} /* for (all iterations) */
			}	 /* if (texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
			 texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW) */

			/* Store the descriptor */
			m_test_runs.push_back(new_test_run);
		} /* for (all texture targets) */
	}	 /* for (all texture types) */
}